

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

double GetDefaultSpeed(PClassActor *type)

{
  int iVar1;
  double dVar2;
  
  if (type != (PClassActor *)0x0) {
    iVar1 = G_SkillProperty(SKILLP_FastMonsters);
    if ((iVar1 == 0) || (dVar2 = type->FastSpeed, dVar2 < 0.0)) {
      dVar2 = *(double *)((type->super_PClass).Defaults + 0xe0);
    }
    return dVar2;
  }
  return 0.0;
}

Assistant:

static double GetDefaultSpeed(PClassActor *type)
{
	if (type == NULL)
		return 0;
	else if (G_SkillProperty(SKILLP_FastMonsters) && type->FastSpeed >= 0)
		return type->FastSpeed;
	else
		return GetDefaultByType(type)->Speed;
}